

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O0

item_accessor * __thiscall
pybind11::detail::object_api<pybind11::handle>::operator[]
          (item_accessor *__return_storage_ptr__,object_api<pybind11::handle> *this,char *key)

{
  handle *phVar1;
  object local_38;
  object local_30;
  handle local_28;
  char *local_20;
  char *key_local;
  object_api<pybind11::handle> *this_local;
  
  local_20 = key;
  key_local = (char *)this;
  this_local = (object_api<pybind11::handle> *)__return_storage_ptr__;
  phVar1 = derived(this);
  local_28.m_ptr = phVar1->m_ptr;
  str::str((str *)&local_38,local_20);
  object::object(&local_30,&local_38);
  accessor<pybind11::detail::accessor_policies::generic_item>::accessor
            (__return_storage_ptr__,local_28,&local_30);
  object::~object(&local_30);
  str::~str((str *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

item_accessor object_api<D>::operator[](const char *key) const {
    return {derived(), pybind11::str(key)};
}